

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_app.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  mbedtls_pk_type_t mVar4;
  char *pcVar5;
  size_t sVar6;
  FILE *__stream;
  char *pcVar7;
  mbedtls_rsa_context *pmVar8;
  mbedtls_ecp_keypair *pmVar9;
  char *__s1;
  mbedtls_ecp_keypair *ecp_1;
  mbedtls_rsa_context *rsa_1;
  mbedtls_ecp_keypair *ecp;
  mbedtls_rsa_context *rsa;
  FILE *f;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi E;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi N;
  mbedtls_pk_context pk;
  char *q;
  char *p;
  char local_428 [4];
  int i;
  char buf [1024];
  int local_20;
  int local_1c;
  int exit_code;
  int ret;
  char **argv_local;
  int argc_local;
  
  local_1c = 1;
  local_20 = 1;
  mbedtls_pk_init((mbedtls_pk_context *)&N.p);
  memset(local_428,0,0x400);
  mbedtls_mpi_init((mbedtls_mpi *)&P.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_init((mbedtls_mpi *)&D.p);
  mbedtls_mpi_init((mbedtls_mpi *)&E.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DP.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DQ.p);
  mbedtls_mpi_init((mbedtls_mpi *)&QP.p);
  mbedtls_mpi_init((mbedtls_mpi *)&f);
  if (argc != 0) {
    opt.mode = 0;
    opt.filename = "keyfile.key";
    opt.password = anon_var_dwarf_cf0e + 9;
    opt.password_file = anon_var_dwarf_cf0e + 9;
    for (p._4_4_ = 1; p._4_4_ < argc; p._4_4_ = p._4_4_ + 1) {
      pcVar7 = argv[p._4_4_];
      pcVar5 = strchr(pcVar7,0x3d);
      if (pcVar5 == (char *)0x0) goto LAB_0010b34e;
      __s1 = pcVar5 + 1;
      *pcVar5 = '\0';
      iVar3 = strcmp(pcVar7,"mode");
      if (iVar3 == 0) {
        iVar3 = strcmp(__s1,"private");
        if (iVar3 == 0) {
          opt.mode = 1;
          pcVar5 = opt.filename;
          pcVar1 = opt.password;
          pcVar2 = opt.password_file;
        }
        else {
          iVar3 = strcmp(__s1,"public");
          if (iVar3 != 0) goto LAB_0010b34e;
          opt.mode = 2;
          pcVar5 = opt.filename;
          pcVar1 = opt.password;
          pcVar2 = opt.password_file;
        }
      }
      else {
        iVar3 = strcmp(pcVar7,"filename");
        pcVar5 = __s1;
        pcVar1 = opt.password;
        pcVar2 = opt.password_file;
        if (((iVar3 != 0) &&
            (iVar3 = strcmp(pcVar7,"password"), pcVar5 = opt.filename, pcVar1 = __s1,
            pcVar2 = opt.password_file, iVar3 != 0)) &&
           (iVar3 = strcmp(pcVar7,"password_file"), pcVar5 = opt.filename, pcVar1 = opt.password,
           pcVar2 = __s1, iVar3 != 0)) goto LAB_0010b34e;
      }
      opt.password_file = pcVar2;
      opt.password = pcVar1;
      opt.filename = pcVar5;
    }
    if (opt.mode == 1) {
      sVar6 = strlen(opt.password);
      if ((sVar6 == 0) || (sVar6 = strlen(opt.password_file), sVar6 == 0)) {
        sVar6 = strlen(opt.password_file);
        if (sVar6 != 0) {
          printf("\n  . Loading the password file ...");
          __stream = fopen(opt.password_file,"rb");
          if (__stream == (FILE *)0x0) {
            printf(" failed\n  !  fopen returned NULL\n");
            goto LAB_0010bc39;
          }
          pcVar7 = fgets(local_428,0x400,__stream);
          if (pcVar7 == (char *)0x0) {
            fclose(__stream);
            printf("Error: fgets() failed to retrieve password\n");
            goto LAB_0010bc39;
          }
          fclose(__stream);
          sVar6 = strlen(local_428);
          iVar3 = (int)sVar6;
          if (local_428[iVar3 + -1] == '\n') {
            local_428[iVar3 + -1] = '\0';
          }
          if (local_428[iVar3 + -2] == '\r') {
            local_428[iVar3 + -2] = '\0';
          }
          opt.password = local_428;
        }
        printf("\n  . Loading the private key ...");
        fflush(_stdout);
        local_1c = mbedtls_pk_parse_keyfile((mbedtls_pk_context *)&N.p,opt.filename,opt.password);
        if (local_1c != 0) {
          printf(" failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x\n",(ulong)(uint)-local_1c)
          ;
          goto LAB_0010bc39;
        }
        printf(" ok\n");
        printf("  . Key information    ...\n");
        mVar4 = mbedtls_pk_get_type((mbedtls_pk_context *)&N.p);
        if (mVar4 == MBEDTLS_PK_RSA) {
          pmVar8 = mbedtls_pk_rsa(stack0xfffffffffffffbb0);
          local_1c = mbedtls_rsa_export(pmVar8,(mbedtls_mpi *)&P.p,(mbedtls_mpi *)&Q.p,
                                        (mbedtls_mpi *)&D.p,(mbedtls_mpi *)&E.p,(mbedtls_mpi *)&DP.p
                                       );
          if ((local_1c != 0) ||
             (local_1c = mbedtls_rsa_export_crt
                                   (pmVar8,(mbedtls_mpi *)&DQ.p,(mbedtls_mpi *)&QP.p,
                                    (mbedtls_mpi *)&f), local_1c != 0)) {
            printf(" failed\n  ! could not export RSA parameters\n\n");
            goto LAB_0010bc39;
          }
          local_1c = mbedtls_mpi_write_file("N:  ",(mbedtls_mpi *)&P.p,0x10,(FILE *)0x0);
          if (((((local_1c != 0) ||
                (local_1c = mbedtls_mpi_write_file("E:  ",(mbedtls_mpi *)&DP.p,0x10,(FILE *)0x0),
                local_1c != 0)) ||
               (local_1c = mbedtls_mpi_write_file("D:  ",(mbedtls_mpi *)&E.p,0x10,(FILE *)0x0),
               local_1c != 0)) ||
              ((local_1c = mbedtls_mpi_write_file("P:  ",(mbedtls_mpi *)&Q.p,0x10,(FILE *)0x0),
               local_1c != 0 ||
               (local_1c = mbedtls_mpi_write_file("Q:  ",(mbedtls_mpi *)&D.p,0x10,(FILE *)0x0),
               local_1c != 0)))) ||
             ((local_1c = mbedtls_mpi_write_file("DP: ",(mbedtls_mpi *)&DQ.p,0x10,(FILE *)0x0),
              local_1c != 0 ||
              (local_1c = mbedtls_mpi_write_file("DQ:  ",(mbedtls_mpi *)&QP.p,0x10,(FILE *)0x0),
              local_1c != 0)))) goto LAB_0010bc39;
          local_1c = mbedtls_mpi_write_file("QP:  ",(mbedtls_mpi *)&f,0x10,(FILE *)0x0);
        }
        else {
          mVar4 = mbedtls_pk_get_type((mbedtls_pk_context *)&N.p);
          if (mVar4 != MBEDTLS_PK_ECKEY) {
            printf("Do not know how to print key information for this type\n");
            goto LAB_0010bc39;
          }
          pmVar9 = mbedtls_pk_ec(stack0xfffffffffffffbb0);
          local_1c = mbedtls_mpi_write_file("Q(X): ",&(pmVar9->Q).X,0x10,(FILE *)0x0);
          if (((local_1c != 0) ||
              (local_1c = mbedtls_mpi_write_file("Q(Y): ",&(pmVar9->Q).Y,0x10,(FILE *)0x0),
              local_1c != 0)) ||
             (local_1c = mbedtls_mpi_write_file("Q(Z): ",&(pmVar9->Q).Z,0x10,(FILE *)0x0),
             local_1c != 0)) goto LAB_0010bc39;
          local_1c = mbedtls_mpi_write_file("D   : ",&pmVar9->d,0x10,(FILE *)0x0);
        }
joined_r0x0010bc0f:
        if (local_1c == 0) {
          local_20 = 0;
        }
        goto LAB_0010bc39;
      }
      printf("Error: cannot have both password and password_file\n");
    }
    else if (opt.mode == 2) {
      printf("\n  . Loading the public key ...");
      fflush(_stdout);
      local_1c = mbedtls_pk_parse_public_keyfile((mbedtls_pk_context *)&N.p,opt.filename);
      if (local_1c != 0) {
        printf(" failed\n  !  mbedtls_pk_parse_public_keyfile returned -0x%04x\n",
               (ulong)(uint)-local_1c);
        goto LAB_0010bc39;
      }
      printf(" ok\n");
      printf("  . Key information    ...\n");
      mVar4 = mbedtls_pk_get_type((mbedtls_pk_context *)&N.p);
      if (mVar4 == MBEDTLS_PK_RSA) {
        pmVar8 = mbedtls_pk_rsa(stack0xfffffffffffffbb0);
        local_1c = mbedtls_rsa_export(pmVar8,(mbedtls_mpi *)&P.p,(mbedtls_mpi *)0x0,
                                      (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)&DP.p);
        if (local_1c != 0) {
          printf(" failed\n  ! could not export RSA parameters\n\n");
          goto LAB_0010bc39;
        }
        local_1c = mbedtls_mpi_write_file("N:  ",(mbedtls_mpi *)&P.p,0x10,(FILE *)0x0);
        if (local_1c != 0) goto LAB_0010bc39;
        local_1c = mbedtls_mpi_write_file("E:  ",(mbedtls_mpi *)&DP.p,0x10,(FILE *)0x0);
      }
      else {
        mVar4 = mbedtls_pk_get_type((mbedtls_pk_context *)&N.p);
        if (mVar4 != MBEDTLS_PK_ECKEY) {
          printf("Do not know how to print key information for this type\n");
          goto LAB_0010bc39;
        }
        pmVar9 = mbedtls_pk_ec(stack0xfffffffffffffbb0);
        local_1c = mbedtls_mpi_write_file("Q(X): ",&(pmVar9->Q).X,0x10,(FILE *)0x0);
        if ((local_1c != 0) ||
           (local_1c = mbedtls_mpi_write_file("Q(Y): ",&(pmVar9->Q).Y,0x10,(FILE *)0x0),
           local_1c != 0)) goto LAB_0010bc39;
        local_1c = mbedtls_mpi_write_file("Q(Z): ",&(pmVar9->Q).Z,0x10,(FILE *)0x0);
      }
      goto joined_r0x0010bc0f;
    }
  }
LAB_0010b34e:
  printf(
        "\n usage: key_app param=<>...\n\n acceptable parameters:\n    mode=private|public default: none\n    filename=%%s         default: keyfile.key\n    password=%%s         default: \"\"\n    password_file=%%s    default: \"\"\n\n"
        );
LAB_0010bc39:
  if (local_20 != 0) {
    mbedtls_strerror(local_1c,local_428,0x400);
    printf("  !  Last error was: %s\n",local_428);
  }
  mbedtls_pk_free((mbedtls_pk_context *)&N.p);
  mbedtls_mpi_free((mbedtls_mpi *)&P.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_free((mbedtls_mpi *)&D.p);
  mbedtls_mpi_free((mbedtls_mpi *)&E.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DP.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DQ.p);
  mbedtls_mpi_free((mbedtls_mpi *)&QP.p);
  mbedtls_mpi_free((mbedtls_mpi *)&f);
  return local_20;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    char buf[1024];
    int i;
    char *p, *q;

    mbedtls_pk_context pk;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;

    /*
     * Set to sane values
     */
    mbedtls_pk_init( &pk );
    memset( buf, 0, sizeof(buf) );

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto cleanup;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.password            = DFL_PASSWORD;
    opt.password_file       = DFL_PASSWORD_FILE;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "private" ) == 0 )
                opt.mode = MODE_PRIVATE;
            else if( strcmp( q, "public" ) == 0 )
                opt.mode = MODE_PUBLIC;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "password" ) == 0 )
            opt.password = q;
        else if( strcmp( p, "password_file" ) == 0 )
            opt.password_file = q;
        else
            goto usage;
    }

    if( opt.mode == MODE_PRIVATE )
    {
        if( strlen( opt.password ) && strlen( opt.password_file ) )
        {
            mbedtls_printf( "Error: cannot have both password and password_file\n" );
            goto usage;
        }

        if( strlen( opt.password_file ) )
        {
            FILE *f;

            mbedtls_printf( "\n  . Loading the password file ..." );
            if( ( f = fopen( opt.password_file, "rb" ) ) == NULL )
            {
                mbedtls_printf( " failed\n  !  fopen returned NULL\n" );
                goto cleanup;
            }
            if( fgets( buf, sizeof(buf), f ) == NULL )
            {
                fclose( f );
                mbedtls_printf( "Error: fgets() failed to retrieve password\n" );
                goto cleanup;
            }
            fclose( f );

            i = (int) strlen( buf );
            if( buf[i - 1] == '\n' ) buf[i - 1] = '\0';
            if( buf[i - 2] == '\r' ) buf[i - 2] = '\0';
            opt.password = buf;
        }

        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the private key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_keyfile( &pk, opt.filename, opt.password );

        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_keyfile returned -0x%04x\n", -ret );
            goto cleanup;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the key
         */
        mbedtls_printf( "  . Key information    ...\n" );
#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( pk );

            if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
                ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto cleanup;
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "N:  ", &N, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "E:  ", &E, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "D:  ", &D, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "P:  ", &P, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q:  ", &Q, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "DP: ", &DP, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL ) );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( pk );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "D   : ", &ecp->d  , 16, NULL ) );
        }
        else
#endif
        {
            mbedtls_printf("Do not know how to print key information for this type\n" );
            goto cleanup;
        }
    }
    else if( opt.mode == MODE_PUBLIC )
    {
        /*
         * 1.1. Load the key
         */
        mbedtls_printf( "\n  . Loading the public key ..." );
        fflush( stdout );

        ret = mbedtls_pk_parse_public_keyfile( &pk, opt.filename );

        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_pk_parse_public_keyfile returned -0x%04x\n", -ret );
            goto cleanup;
        }

        mbedtls_printf( " ok\n" );

        mbedtls_printf( "  . Key information    ...\n" );
#if defined(MBEDTLS_RSA_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_RSA )
        {
            mbedtls_rsa_context *rsa = mbedtls_pk_rsa( pk );

            if( ( ret = mbedtls_rsa_export( rsa, &N, NULL, NULL,
                                            NULL, &E ) ) != 0 )
            {
                mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
                goto cleanup;
            }
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "N:  ", &N, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "E:  ", &E, 16, NULL ) );
        }
        else
#endif
#if defined(MBEDTLS_ECP_C)
        if( mbedtls_pk_get_type( &pk ) == MBEDTLS_PK_ECKEY )
        {
            mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( pk );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(X): ", &ecp->Q.X, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Y): ", &ecp->Q.Y, 16, NULL ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_write_file( "Q(Z): ", &ecp->Q.Z, 16, NULL ) );
        }
        else
#endif
        {
            mbedtls_printf("Do not know how to print key information for this type\n" );
            goto cleanup;
        }
    }
    else
        goto usage;

    exit_code = MBEDTLS_EXIT_SUCCESS;

cleanup:

#if defined(MBEDTLS_ERROR_C)
    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( "  !  Last error was: %s\n", buf );
    }
#endif

    mbedtls_pk_free( &pk );
    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}